

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O3

void fy_advance(fy_parser *fyp,int c)

{
  int iVar1;
  size_t advance;
  
  if (c < 0x80) {
    fy_advance_octets(fyp,1);
    if (c != 0xd) goto LAB_0012b62a;
    iVar1 = fy_parse_peek_at_offset(fyp,0);
    if (iVar1 == 10) {
      fy_advance_octets(fyp,1);
      goto LAB_0012b688;
    }
    if (fyp != (fy_parser *)0x0) goto LAB_0012b688;
  }
  else {
    advance = 2;
    if (0x7ff < (uint)c) {
      advance = 4 - (ulong)((uint)c < 0x10000);
    }
    fy_advance_octets(fyp,advance);
LAB_0012b62a:
    if ((fyp != (fy_parser *)0x0) &&
       (((c == 10 || (c == 0xd)) ||
        (((fyp->current_input == (fy_input *)0x0 || ((fyp->current_input->field_0x74 & 1) == 0)) &&
         ((c - 0x2028U < 2 || (c == 0x85)))))))) {
LAB_0012b688:
      fyp->column = 0;
      fyp->nontab_column = 0;
      fyp->line = fyp->line + 1;
      return;
    }
    iVar1 = fyp->tabsize;
    if (c == 9 && iVar1 != 0) {
      fyp->column = (fyp->column + iVar1) - fyp->column % iVar1;
      goto LAB_0012b698;
    }
  }
  fyp->column = fyp->column + 1;
LAB_0012b698:
  fyp->nontab_column = fyp->nontab_column + 1;
  return;
}

Assistant:

static inline void fy_advance(struct fy_parser *fyp, int c) {
    bool is_line_break = false;

    /* skip this character */
    fy_advance_octets(fyp, fy_utf8_width(c));

    /* first check for CR/LF */
    if (c == '\r' && fy_parse_peek(fyp) == '\n') {
        fy_advance_octets(fyp, 1);
        is_line_break = true;
    } else if (fyp_is_lb(fyp, c))
        is_line_break = true;

    if (is_line_break) {
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line++;
    } else if (fyp->tabsize && fy_is_tab(c)) {
        fyp->column += (fyp->tabsize - (fyp->column % fyp->tabsize));
        fyp->nontab_column++;
    } else {
        fyp->column++;
        fyp->nontab_column++;
    }
}